

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O2

int error_sprintf(C_Parser *parser,char *fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar5;
  uint uVar6;
  bool bVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  iVar1 = 0;
  iVar2 = 0;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (parser->error_message != (char *)0x0) {
    sVar3 = strlen(parser->error_message);
    iVar1 = (int)sVar3;
  }
  uVar6 = 0x80;
  iVar5 = 2;
  while( true ) {
    bVar7 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar7) {
      return iVar2;
    }
    pcVar4 = (char *)(*parser->memory_allocator->realloc)
                               (parser->memory_allocator->arena,parser->error_message,
                                (long)(int)(uVar6 + iVar1));
    parser->error_message = pcVar4;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].reg_save_area = local_e8;
    args[0].gp_offset = 0x10;
    args[0].fp_offset = 0x30;
    iVar2 = vsnprintf(parser->error_message + iVar1,(ulong)uVar6,fmt,args);
    if (iVar2 < (int)uVar6) break;
    uVar6 = iVar2 + 1;
  }
  if (-1 < iVar2) {
    return iVar2;
  }
  fwrite("Buffer conversion error\n",0x18,1,_stderr);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/chibicc/chibicc_tokenize.c"
                ,0x2c,"int error_sprintf(C_Parser *, const char *, ...)");
}

Assistant:

static int error_sprintf(C_Parser *parser, const char *fmt, ...) {
  va_list args;
  int pos = parser->error_message ? (int)strlen(parser->error_message) : 0;
  int estimated_size = 128;
  int n = 0;
  for (int i = 0; i < 2; i++) {
    parser->error_message = parser->memory_allocator->realloc(parser->memory_allocator->arena, parser->error_message, pos + estimated_size); // ensure we have at least estimated_size free space
    va_start(args, fmt);
    n = vsnprintf(parser->error_message + pos, estimated_size, fmt, args);
    va_end(args);
    if (n >= estimated_size) {
      estimated_size = n + 1; // allow for 0 byte
    } else if (n < 0) {
      fprintf(stderr, "Buffer conversion error\n");
      assert(false);
      break;
    } else {
      break;
    }
  }
  return n;
}